

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O3

int Acec_TreeVerifyPhaseOne_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  pGVar1 = p->pObjs;
  if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar2 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar2) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->pTravIds[iVar2] == p->nTravIds) {
    uVar3 = pObj->Value;
  }
  else {
    p->pTravIds[iVar2] = p->nTravIds;
    uVar5 = (uint)*(undefined8 *)pObj;
    if (((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecTree.c"
                    ,0xf7,"int Acec_TreeVerifyPhaseOne_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    if ((uVar5 & 0x1fffffff) < ((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff)) {
      __assert_fail("!Gia_ObjIsXor(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecTree.c"
                    ,0xf8,"int Acec_TreeVerifyPhaseOne_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar3 = Acec_TreeVerifyPhaseOne_rec(p,pObj + -(ulong)(uVar5 & 0x1fffffff));
    uVar4 = Acec_TreeVerifyPhaseOne_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    uVar5 = ~uVar3 & 0xff;
    if (((uint)*(ulong *)pObj >> 0x1d & 1) == 0) {
      uVar5 = uVar3;
    }
    uVar3 = ~uVar4 & 0xff;
    if ((*(ulong *)pObj >> 0x3d & 1) == 0) {
      uVar3 = uVar4;
    }
    uVar3 = uVar3 & uVar5;
    pObj->Value = uVar3;
  }
  return uVar3;
}

Assistant:

int Acec_TreeVerifyPhaseOne_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int Truth0, Truth1;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return pObj->Value;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( Gia_ObjIsAnd(pObj) );
    assert( !Gia_ObjIsXor(pObj) );
    Truth0 = Acec_TreeVerifyPhaseOne_rec( p, Gia_ObjFanin0(pObj) );
    Truth1 = Acec_TreeVerifyPhaseOne_rec( p, Gia_ObjFanin1(pObj) );
    Truth0 = Gia_ObjFaninC0(pObj) ? 0xFF & ~Truth0 : Truth0;
    Truth1 = Gia_ObjFaninC1(pObj) ? 0xFF & ~Truth1 : Truth1;
    return (pObj->Value = Truth0 & Truth1);
}